

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::isUInt64(Value *this)

{
  char cVar1;
  double *in_RDI;
  bool local_21;
  bool local_1;
  
  cVar1 = *(char *)(in_RDI + 1);
  if (cVar1 == '\x01') {
    local_1 = -1 < (long)*in_RDI;
  }
  else if (cVar1 == '\x02') {
    local_1 = true;
  }
  else if (cVar1 == '\x03') {
    local_21 = false;
    if ((0.0 <= *in_RDI) &&
       (local_21 = false, *in_RDI <= 1.8446744073709552e+19 && *in_RDI != 1.8446744073709552e+19)) {
      local_21 = IsIntegral((double)in_RDI);
    }
    local_1 = local_21;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Value::isUInt64() const {
#if defined(JSON_HAS_INT64)
  switch (type_) {
  case intValue:
    return value_.int_ >= 0;
  case uintValue:
    return true;
  case realValue:
    // Note that maxUInt64 (= 2^64 - 1) is not exactly representable as a
    // double, so double(maxUInt64) will be rounded up to 2^64. Therefore we
    // require the value to be strictly less than the limit.
    return value_.real_ >= 0 && value_.real_ < maxUInt64AsDouble &&
           IsIntegral(value_.real_);
  default:
    break;
  }
#endif // JSON_HAS_INT64
  return false;
}